

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::ValidateKernelDecl(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  NonSemanticClspvReflectionInstructions NVar4;
  Instruction *this;
  char *pcVar5;
  DiagnosticStream local_200;
  
  uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,4);
  this = ValidationState_t::FindDef(_,uVar2);
  if ((this != (Instruction *)0x0) &&
     (bVar1 = spvIsExtendedInstruction((uint)(this->inst_).opcode), bVar1)) {
    uVar2 = Instruction::GetOperandAs<unsigned_int>(this,2);
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    if (uVar2 != uVar3) {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
      pcVar5 = "Kernel must be from the same extended instruction import";
      goto LAB_0028a25a;
    }
    NVar4 = Instruction::GetOperandAs<NonSemanticClspvReflectionInstructions>(this,3);
    if (NVar4 == NonSemanticClspvReflectionKernel) {
      return SPV_SUCCESS;
    }
  }
  ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
  pcVar5 = "Kernel must be a Kernel extended instruction";
LAB_0028a25a:
  std::operator<<((ostream *)&local_200,pcVar5);
  DiagnosticStream::~DiagnosticStream(&local_200);
  return local_200.error_;
}

Assistant:

spv_result_t ValidateKernelDecl(ValidationState_t& _, const Instruction* inst) {
  const auto decl_id = inst->GetOperandAs<uint32_t>(4);
  const auto decl = _.FindDef(decl_id);
  if (!decl || !spvIsExtendedInstruction(decl->opcode())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Kernel must be a Kernel extended instruction";
  }

  if (decl->GetOperandAs<uint32_t>(2) != inst->GetOperandAs<uint32_t>(2)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Kernel must be from the same extended instruction import";
  }

  const auto ext_inst =
      decl->GetOperandAs<NonSemanticClspvReflectionInstructions>(3);
  if (ext_inst != NonSemanticClspvReflectionKernel) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Kernel must be a Kernel extended instruction";
  }

  return SPV_SUCCESS;
}